

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O2

Preinstruction __thiscall
InstructionSet::M68k::Predecoder<(InstructionSet::M68k::Model)1>::validated<(unsigned_char)69,true>
          (Predecoder<(InstructionSet::M68k::Model)1> *this,AddressingMode op1_mode,int op1_reg,
          AddressingMode op2_mode,int op2_reg,Condition condition,int additional_extension_words)

{
  Preinstruction PVar1;
  
  if (((0x10000 << (op1_mode & (AddressRegisterIndirectWithIndexBaseDisplacement|ExtensionWord)) |
       1 << (op2_mode & 0x1f)) & 0xbffefffeU) != 0) {
    PVar1.operation = Undefined;
    PVar1.operands_[0] = '\r';
    PVar1.operands_[1] = '\r';
    PVar1.flags_ = '\0';
    return PVar1;
  }
  return (Preinstruction)
         ((op1_reg << 8 | (uint)op1_mode << 0xb) & 0xffff |
          (op2_reg << 0x10 | (uint)op2_mode << 0x13) & 0xff0000 |
          (uint)(additional_extension_words != 0) << 0x1e |
          (condition | additional_extension_words) << 0x1a | 0x45);
}

Assistant:

Preinstruction Predecoder<model>::validated(
	AddressingMode op1_mode, int op1_reg,
	AddressingMode op2_mode, int op2_reg,
	Condition condition,
	int additional_extension_words
) {
	constexpr auto operation = Predecoder<model>::operation(op);

	if constexpr (!validate) {
		return Preinstruction(
			operation,
			op1_mode, op1_reg,
			op2_mode, op2_reg,
			requires_supervisor<model>(operation),
			additional_extension_words,
			operand_size(operation),
			condition);
	}

	const auto invalid = invalid_operands<op>();
	const auto observed = operand_mask(op1_mode, op2_mode);
	return (observed & invalid) ?
		Preinstruction() :
		Preinstruction(
			operation,
			op1_mode, op1_reg,
			op2_mode, op2_reg,
			requires_supervisor<model>(operation),
			additional_extension_words,
			operand_size(operation),
			condition);
}